

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

int __thiscall
helics::zeromq::ZmqComms::replyToIncomingMessage(ZmqComms *this,message_t *msg,socket_t *sock)

{
  bool bVar1;
  size_t in_RCX;
  socket_base *in_RDX;
  ActionMessage *in_RDI;
  int in_R8D;
  string str;
  ActionMessage resp;
  string str_1;
  ActionMessage reply;
  bool useJson;
  ActionMessage M;
  ActionMessage *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd5c;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffd60;
  void *in_stack_fffffffffffffd68;
  ActionMessage *in_stack_fffffffffffffd70;
  ActionMessage *in_stack_fffffffffffffd98;
  ActionMessage *in_stack_fffffffffffffe00;
  NetworkCommsInterface *in_stack_fffffffffffffe08;
  undefined1 local_1c8 [216];
  undefined4 local_f0;
  byte local_d9;
  ActionMessage local_d8;
  socket_base *local_20;
  int local_4;
  
  local_20 = in_RDX;
  zmq::message_t::data((message_t *)in_RDI);
  zmq::message_t::size((message_t *)in_RDI);
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(size_t)in_stack_fffffffffffffd60);
  local_d9 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                       (&local_d8,use_json_serialization_flag);
  startingAction = CONCAT13(local_d9,(int3)in_stack_fffffffffffffd5c);
  bVar1 = isProtocolCommand(in_RDI);
  if (bVar1) {
    if (local_d8.messageID == 0x16570bf) {
      local_4 = -1;
      local_f0 = 1;
    }
    else {
      NetworkCommsInterface::generateReplyToIncomingMessage
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      if ((local_d9 & 1) == 0) {
        ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffffd98);
      }
      else {
        ActionMessage::to_json_string_abi_cxx11_
                  ((ActionMessage *)reply.payload.buffer._M_elems._8_8_);
      }
      zmq::detail::socket_base::send(local_20,(int)local_1c8,(void *)0x0,in_RCX,in_R8D);
      local_4 = 0;
      local_f0 = 1;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      ActionMessage::~ActionMessage(in_RDI);
    }
  }
  else {
    std::function<void_(helics::ActionMessage_&&)>::operator()
              ((function<void_(helics::ActionMessage_&&)> *)in_RDI,in_stack_fffffffffffffd38);
    ActionMessage::ActionMessage(in_stack_fffffffffffffd60,startingAction);
    if ((local_d9 & 1) == 0) {
      ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffffd98);
    }
    else {
      ActionMessage::to_json_string_abi_cxx11_((ActionMessage *)reply.payload.buffer._M_elems._8_8_)
      ;
    }
    zmq::detail::socket_base::send(local_20,(int)&stack0xfffffffffffffd60,(void *)0x0,in_RCX,in_R8D)
    ;
    local_4 = 0;
    local_f0 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    ActionMessage::~ActionMessage(in_RDI);
  }
  ActionMessage::~ActionMessage(in_RDI);
  return local_4;
}

Assistant:

int ZmqComms::replyToIncomingMessage(zmq::message_t& msg, zmq::socket_t& sock)
{
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    bool useJson = checkActionFlag(M, use_json_serialization_flag);
    if (isProtocolCommand(M)) {
        if (M.messageID == CLOSE_RECEIVER) {
            return (-1);
        }
        auto reply = generateReplyToIncomingMessage(M);
        auto str = (useJson) ? reply.to_json_string() : reply.to_string();

        sock.send(str);
        return 0;
    }

    ActionCallback(std::move(M));
    ActionMessage resp(CMD_PRIORITY_ACK);
    auto str = (useJson) ? resp.to_json_string() : resp.to_string();
    sock.send(str);
    return 0;
}